

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O1

void __thiscall solitaire::graphics::Renderer::renderTableauPile(Renderer *this,PileId *id)

{
  int iVar1;
  uint topCoveredCardPosition;
  undefined4 extraout_var;
  long *plVar2;
  Cards *pileCards;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->context->_vptr_Context[5])();
  plVar2 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x70))
                             ((long *)CONCAT44(extraout_var,iVar1));
  pileCards = (Cards *)(**(code **)(*plVar2 + 0x38))(plVar2);
  iVar1 = (*this->context->_vptr_Context[9])();
  if ((pileCards->
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (pileCards->
      super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    topCoveredCardPosition = (**(code **)(*plVar2 + 0x40))(plVar2);
    renderTableauPileWithCards
              (this,(TableauPileCollider *)CONCAT44(extraout_var_00,iVar1),pileCards,
               topCoveredCardPosition);
  }
  return;
}

Assistant:

void Renderer::renderTableauPile(const PileId id) const {
    const auto& pile = context.getSolitaire().getTableauPile(id);
    const auto& pileCards = pile.getCards();
    const auto& pileCollider = context.getTableauPileCollider(id);

    if (not pileCards.empty())
        renderTableauPileWithCards(
            pileCollider,pileCards, pile.getTopCoveredCardPosition());
}